

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O0

void ggml_numa_init(ggml_numa_strategy numa_flag)

{
  uint uVar1;
  _Bool _Var2;
  int iVar3;
  char *pcVar4;
  ggml_numa_strategy in_EDI;
  char buf [42];
  FILE *fptr;
  uint32_t c;
  ggml_numa_node *node;
  uint32_t n;
  int getcpu_ret;
  uint current_cpu;
  int rv;
  char path [256];
  stat st;
  char acStack_278 [48];
  FILE *local_248;
  uint local_23c;
  long local_238;
  uint local_22c;
  undefined4 local_228;
  undefined1 local_224 [4];
  undefined1 local_220 [132];
  uint local_19c;
  char local_198 [256];
  stat local_98;
  
  if (g_state.numa.n_nodes != 0) {
    fprintf(_stderr,"ggml_numa_init: NUMA already initialized\n");
    return;
  }
  g_state.numa.numa_strategy = in_EDI;
  ggml_get_numa_affinity();
  memcpy(&g_state.numa.cpuset,local_220,0x80);
  for (; g_state.numa.n_nodes < 8; g_state.numa.n_nodes = g_state.numa.n_nodes + 1) {
    local_19c = snprintf(local_198,0x100,"/sys/devices/system/node/node%u",
                         (ulong)g_state.numa.n_nodes);
    if (((int)local_19c < 1) || (0xff < local_19c)) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu.c"
                 ,0x25c,"GGML_ASSERT(%s) failed","rv > 0 && (unsigned)rv < sizeof(path)");
    }
    iVar3 = stat(local_198,&local_98);
    if (iVar3 != 0) break;
  }
  do {
    if (0x1ff < g_state.numa.total_cpus) {
LAB_00110fdb:
      local_228 = 0;
      iVar3 = getcpu(local_224,0x1cfe54);
      if (((g_state.numa.n_nodes == 0) || (g_state.numa.total_cpus == 0)) || (iVar3 != 0)) {
        g_state.numa.n_nodes = 0;
        return;
      }
      local_228 = 0;
      for (local_22c = 0; local_22c < g_state.numa.n_nodes; local_22c = local_22c + 1) {
        local_238 = (ulong)local_22c * 0x804 + 0x1cbe2c;
        g_state.numa.nodes[local_22c].n_cpus = 0;
        for (local_23c = 0; local_23c < g_state.numa.total_cpus; local_23c = local_23c + 1) {
          local_19c = snprintf(local_198,0x100,"/sys/devices/system/node/node%u/cpu%u",
                               (ulong)local_22c,(ulong)local_23c);
          if (((int)local_19c < 1) || (0xff < local_19c)) {
            ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu.c"
                       ,0x285,"GGML_ASSERT(%s) failed","rv > 0 && (unsigned)rv < sizeof(path)");
          }
          iVar3 = stat(local_198,&local_98);
          if (iVar3 == 0) {
            uVar1 = *(uint *)(local_238 + 0x800);
            *(uint *)(local_238 + 0x800) = uVar1 + 1;
            *(uint *)(local_238 + (ulong)uVar1 * 4) = local_23c;
          }
        }
      }
      _Var2 = ggml_is_numa();
      if (!_Var2) {
        return;
      }
      local_248 = fopen("/proc/sys/kernel/numa_balancing","r");
      if (local_248 == (FILE *)0x0) {
        return;
      }
      pcVar4 = fgets(acStack_278,0x2a,local_248);
      if ((pcVar4 != (char *)0x0) && (iVar3 = strncmp(acStack_278,"0\n",0x2a), iVar3 != 0)) {
        ggml_log_internal(3,
                          "/proc/sys/kernel/numa_balancing is enabled, this has been observed to impair performance\n"
                         );
      }
      fclose(local_248);
      return;
    }
    local_19c = snprintf(local_198,0x100,"/sys/devices/system/cpu/cpu%u",
                         (ulong)g_state.numa.total_cpus);
    if (((int)local_19c < 1) || (0xff < local_19c)) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu.c"
                 ,0x264,"GGML_ASSERT(%s) failed","rv > 0 && (unsigned)rv < sizeof(path)");
    }
    iVar3 = stat(local_198,&local_98);
    if (iVar3 != 0) goto LAB_00110fdb;
    g_state.numa.total_cpus = g_state.numa.total_cpus + 1;
  } while( true );
}

Assistant:

void ggml_numa_init(enum ggml_numa_strategy numa_flag) {
    if (g_state.numa.n_nodes > 0) {
        fprintf(stderr, "ggml_numa_init: NUMA already initialized\n");

        return;
    }

#if defined(__gnu_linux__)
    struct stat st;
    char path[256];
    int rv;

    // set numa scheme
    g_state.numa.numa_strategy = numa_flag;

    GGML_PRINT_DEBUG("numa strategy %u\n",g_state.numa.numa_strategy);

    g_state.numa.cpuset = ggml_get_numa_affinity();

    // enumerate nodes
    while (g_state.numa.n_nodes < GGML_NUMA_MAX_NODES) {
        rv = snprintf(path, sizeof(path), "/sys/devices/system/node/node%u", g_state.numa.n_nodes);
        GGML_ASSERT(rv > 0 && (unsigned)rv < sizeof(path));
        if (stat(path, &st) != 0) { break; }
        ++g_state.numa.n_nodes;
    }

    // enumerate CPUs
    while (g_state.numa.total_cpus < GGML_NUMA_MAX_CPUS) {
        rv = snprintf(path, sizeof(path), "/sys/devices/system/cpu/cpu%u", g_state.numa.total_cpus);
        GGML_ASSERT(rv > 0 && (unsigned)rv < sizeof(path));
        if (stat(path, &st) != 0) { break; }
        ++g_state.numa.total_cpus;
    }

    GGML_PRINT_DEBUG("found %u numa nodes, %u CPUs\n", g_state.numa.n_nodes, g_state.numa.total_cpus);

    // figure out which node we're on
    uint current_cpu;
    int getcpu_ret = 0;
#if __GLIBC__ > 2 || (__GLIBC__ == 2 && __GLIBC_MINOR__ > 33) || defined(__COSMOPOLITAN__)
    getcpu_ret = getcpu(&current_cpu, &g_state.numa.current_node);
#else
    // old glibc doesn't have a wrapper for this call. Fall back on direct syscall
#   if !defined(SYS_getcpu) && defined(SYS_get_cpu)
#       define SYS_getcpu SYS_get_cpu // some older glibc versions use this name
#   endif
    getcpu_ret = syscall(SYS_getcpu, &current_cpu, &g_state.numa.current_node);
#endif

    if (g_state.numa.n_nodes < 1 || g_state.numa.total_cpus < 1 || getcpu_ret != 0) {
        g_state.numa.n_nodes = 0;
        return;
    }

    GGML_PRINT_DEBUG("found our process on numa node %u, CPU %u\n", g_state.numa.current_node, current_cpu);

    for (uint32_t n = 0; n < g_state.numa.n_nodes; ++n) {
        struct ggml_numa_node * node = &g_state.numa.nodes[n];
        GGML_PRINT_DEBUG("CPUs on node %u:", n);
        node->n_cpus = 0;
        for (uint32_t c = 0; c < g_state.numa.total_cpus; ++c) {
            rv = snprintf(path, sizeof(path), "/sys/devices/system/node/node%u/cpu%u", n, c);
            GGML_ASSERT(rv > 0 && (unsigned)rv < sizeof(path));
            if (stat(path, &st) == 0) {
                node->cpus[node->n_cpus++] = c;
                GGML_PRINT_DEBUG(" %u", c);
            }
        }
        GGML_PRINT_DEBUG("\n");
    }

    if (ggml_is_numa()) {
        FILE *fptr = fopen("/proc/sys/kernel/numa_balancing", "r");
        if (fptr != NULL) {
            char buf[42];
            if (fgets(buf, sizeof(buf), fptr) && strncmp(buf, "0\n", sizeof(buf)) != 0) {
                GGML_LOG_WARN("/proc/sys/kernel/numa_balancing is enabled, this has been observed to impair performance\n");
            }
            fclose(fptr);
        }
    }
#else
    UNUSED(numa_flag);
    // TODO
#endif
}